

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

void __thiscall
dynet::ScalarInputNode::forward_dev_impl<dynet::Device_CPU>
          (ScalarInputNode *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  Tensor *fx_local;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs_local;
  Device_CPU *dev_local;
  ScalarInputNode *this_local;
  
  *fx->v = *this->pdata;
  return;
}

Assistant:

void ScalarInputNode::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  DYNET_ASSERT(xs.size() == 0, "Failed dimension check in FUNCNAME");
#ifdef __CUDACC__
  cudaMemcpyAsync(fx.v, pdata, 1 * sizeof(float), cudaMemcpyHostToDevice);
#else
  fx.v[0] = *pdata;
#endif
}